

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
* __thiscall
njoy::ENDFtk::file::
Base<njoy::ENDFtk::file::Type<8>,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
           *__return_storage_ptr__,
          Base<njoy::ENDFtk::file::Type<8>,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
          *this,StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  bool bVar1;
  vector<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
  sections;
  vector<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
  local_118;
  _Variant_storage<false,_njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>
  local_100;
  
  local_118.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = StructureDivision::isFend((StructureDivision *)this);
    if (bVar1) break;
    Type<8>::readSection<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((SectionVariant *)&local_100,(Type<8> *)this,division,begin,end,lineNumber);
    std::
    vector<std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>,std::allocator<std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>>
    ::
    emplace_back<std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
              ((vector<std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>,std::allocator<std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>>
                *)&local_118,
               (variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>
                *)&local_100);
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>
    ::~_Variant_storage(&local_100);
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((StructureDivision *)&local_100,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end);
    StructureDivision::operator=((StructureDivision *)this,(StructureDivision *)&local_100);
  }
  Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ::verifyFEND((StructureDivision *)this,(long)end->_M_current);
  Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ::fill(__return_storage_ptr__,&local_118);
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>
  ::~vector(&local_118);
  return __return_storage_ptr__;
}

Assistant:

static auto
read( StructureDivision& division,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber ) {

  std::vector< Section > sections;
  while ( not division.isFend() ) {

    sections.emplace_back( Derived::readSection( division, begin, end, lineNumber ) );
    division = StructureDivision( begin, end, lineNumber );
  }
  verifyFEND( division, lineNumber );
  return fill( std::move( sections ) );
}